

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void proxy_http_process_queue(ProxyNegotiator *pn)

{
  long lVar1;
  ProxyNegotiatorVT *pPVar2;
  SeatPromptResult spr_00;
  SeatPromptResult spr_01;
  _Bool _Var3;
  int iVar4;
  BinarySink *s_00;
  strbuf *buf_o;
  uintmax_t uVar5;
  HttpAuthDetails *pHVar6;
  prompts_t *ppVar7;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var8;
  InteractionReadySeat iseat;
  char *pcVar9;
  uint32_t nonce_count;
  ptrlen pVar10;
  undefined8 in_stack_fffffffffffffb18;
  int local_440;
  undefined1 local_3d8 [8];
  SeatPromptResult spr;
  char buf [2];
  char c;
  _Bool change;
  HttpAuthDetails *auth;
  HttpHeader hdr;
  int n_scanned;
  int min_ver;
  int maj_ver;
  ptrlen local_388;
  ptrlen local_378;
  ptrlen local_368;
  ptrlen local_358;
  ptrlen local_348;
  ptrlen local_338;
  ptrlen local_328;
  ptrlen local_318;
  ptrlen local_308;
  ptrlen local_2f8;
  ptrlen local_2e8;
  ptrlen local_2d8;
  ptrlen local_2c8;
  ulong local_2b8;
  size_t e;
  size_t i;
  undefined1 auStack_2a0 [4];
  char base64_output [4];
  strbuf *base64_input;
  char local_268 [8];
  char dest [512];
  int *crLine;
  HttpProxyNegotiator *s;
  ProxyNegotiator *pn_local;
  
  s_00 = pn[-2].output[0].binarysink_;
  iVar4 = *(int *)&s_00->write;
  if (iVar4 == 0) {
    lVar1 = *(long *)&pn[-2].aborted;
    pcVar9 = conf_get_str(pn->ps->conf,0x10);
    pVar10 = ptrlen_from_asciz(pcVar9);
    BinarySink_put_datapl((BinarySink *)(lVar1 + 0x18),pVar10);
    pPVar2 = pn[-1].vt;
    pcVar9 = conf_get_str(pn->ps->conf,0x11);
    join_0x00000010_0x00000000_ = ptrlen_from_asciz(pcVar9);
    BinarySink_put_datapl((BinarySink *)&pPVar2->type,join_0x00000010_0x00000000_);
    if ((*(long *)(*(long *)&pn[-2].aborted + 0x10) != 0) ||
       ((pn[-1].vt)->free != (_func_void_ProxyNegotiator_ptr *)0x0)) {
      *(undefined1 *)&pn[-1].output[0].ch = 1;
    }
    sk_getaddr(pn->ps->remote_addr,local_268,0x200);
    BinarySink_put_fmt((BinarySink *)(pn[-1].output[0].binarysink_[0].write + 0x18),"%s:%d",
                       local_268,(ulong)(uint)pn->ps->remote_port);
LAB_001218ae:
    BinarySink_put_fmt(pn->output[0].binarysink_,"CONNECT %s HTTP/1.1\r\nHost: %s\r\n",
                       *(undefined8 *)pn[-1].output[0].binarysink_[0].write,
                       *(undefined8 *)pn[-1].output[0].binarysink_[0].write);
    if (*(int *)&(pn[-1].input)->head == 2) {
      pVar10 = make_ptrlen("Proxy-Authorization: Basic ",0x1b);
      BinarySink_put_datapl(pn->output[0].binarysink_,pVar10);
      buf_o = strbuf_new_nm();
      pVar10 = ptrlen_from_strbuf(*(strbuf **)&pn[-2].aborted);
      BinarySink_put_datapl(buf_o->binarysink_,pVar10);
      BinarySink_put_byte(buf_o->binarysink_,':');
      _auStack_2a0 = ptrlen_from_strbuf((strbuf *)pn[-1].vt);
      BinarySink_put_datapl(buf_o->binarysink_,_auStack_2a0);
      e = 0;
      local_2b8 = buf_o->len;
      for (; e < local_2b8; e = e + 3) {
        if (local_2b8 - e < 4) {
          local_440 = (int)local_2b8 - (int)e;
        }
        else {
          local_440 = 3;
        }
        base64_encode_atom(buf_o->u + e,local_440,(char *)((long)&i + 4));
        BinarySink_put_data(pn->output[0].binarysink_,(void *)((long)&i + 4),4);
      }
      strbuf_free(buf_o);
      smemclr((void *)((long)&i + 4),4);
      local_2c8 = make_ptrlen("\r\n",2);
      BinarySink_put_datapl(pn->output[0].binarysink_,local_2c8);
    }
    else if (*(int *)&(pn[-1].input)->head == 3) {
      local_2d8 = make_ptrlen("Proxy-Authorization: Digest ",0x1c);
      BinarySink_put_datapl(pn->output[0].binarysink_,local_2d8);
      local_2e8 = ptrlen_from_strbuf((strbuf *)pn[-2].itr);
      local_2f8 = ptrlen_from_strbuf((strbuf *)(pn[-1].input)->queue_idempotent_callback);
      _Var3 = ptrlen_eq_ptrlen(local_2e8,local_2f8);
      if (!_Var3) {
        *(undefined4 *)&pn[-1].output[0].binarysink_[0].writefmtv = 0;
      }
      local_308 = ptrlen_from_strbuf(*(strbuf **)&pn[-2].aborted);
      local_318 = ptrlen_from_strbuf((strbuf *)pn[-1].vt);
      local_328 = ptrlen_from_strbuf((strbuf *)(pn[-1].input)->buffersize);
      local_338 = make_ptrlen("CONNECT",7);
      local_348 = ptrlen_from_strbuf((strbuf *)pn[-1].output[0].binarysink_[0].write);
      local_358 = make_ptrlen("auth",4);
      local_368 = ptrlen_from_strbuf((strbuf *)(pn[-1].input)->queue_idempotent_callback);
      if (((ulong)pn[-1].input[1].tail & 1) == 0) {
        local_378 = make_ptrlen((void *)0x0,0);
      }
      else {
        local_378 = ptrlen_from_strbuf((strbuf *)(pn[-1].input)->ic);
      }
      nonce_count = *(int *)&pn[-1].output[0].binarysink_[0].writefmtv + 1;
      *(uint32_t *)&pn[-1].output[0].binarysink_[0].writefmtv = nonce_count;
      http_digest_response
                (pn->output[0].binarysink_,local_308,local_318,local_328,local_338,local_348,
                 local_358,local_368,local_378,nonce_count,*(HttpDigestHash *)&(pn[-1].input)->tail,
                 (_Bool)(*(byte *)((long)&pn[-1].input[1].tail + 1) & 1));
      local_388 = make_ptrlen("\r\n",2);
      BinarySink_put_datapl(pn->output[0].binarysink_,local_388);
    }
    _min_ver = make_ptrlen("\r\n",2);
    BinarySink_put_datapl(pn->output[0].binarysink_,_min_ver);
    *(undefined4 *)&s_00->write = 0x1cf;
  }
  else {
    if (iVar4 == 0x1cf) {
      *(undefined8 *)&pn[-1].done = 0;
      pn[-1].aborted = false;
      *(undefined1 *)((long)&pn[-1].ps + 4) = 0;
      strbuf_clear((strbuf *)pn[-2].output[0].binarysink_[0].writefmtv);
      *(undefined4 *)&s_00->write = 0x1da;
LAB_00122014:
      _Var3 = read_line(pn->input,(strbuf *)pn[-2].output[0].binarysink_[0].writefmtv,false);
      if (!_Var3) {
        return;
      }
      iVar4 = __isoc99_sscanf(*(undefined8 *)pn[-2].output[0].binarysink_[0].writefmtv,
                              "HTTP/%d.%d %n%d",&n_scanned,&hdr,&pn[-2].done,&pn[-1].ps);
      if (2 < iVar4) {
        if ((n_scanned < 1) || ((n_scanned == 1 && ((int)hdr < 1)))) {
          *(undefined1 *)((long)&pn[-1].ps + 4) = 1;
        }
        if (*(int *)&pn[-1].ps != 0x197) goto LAB_00122107;
        http_auth_details_free((HttpAuthDetails *)pn[-1].input);
        pHVar6 = http_auth_details_new();
        pn[-1].input = (bufchain *)pHVar6;
        auth_error((HttpAuthDetails *)pn[-1].input,
                   "no Proxy-Authorization header seen in HTTP 407 Proxy Authentication Required response"
                  );
        goto LAB_00122107;
      }
      pcVar9 = dupstr("HTTP response was absent or malformed");
      pn->error = pcVar9;
      *(undefined4 *)&s_00->write = 0;
      return;
    }
    if (iVar4 == 0x1da) goto LAB_00122014;
    if (iVar4 == 0x1ff) {
      while( true ) {
        _Var3 = read_line(pn->input,(strbuf *)pn[-2].output[0].binarysink_[0].binarysink_,true);
        if (!_Var3) {
          return;
        }
        pn[-2].error = (char *)0x0;
        _Var3 = get_token((HttpProxyNegotiator *)s_00);
        if (_Var3) {
          auth._0_4_ = 5;
          iVar4 = strcasecmp((char *)(pn[-2].itr)->vt,"Connection");
          if (iVar4 == 0) {
            auth._0_4_ = 0;
          }
          iVar4 = strcasecmp((char *)(pn[-2].itr)->vt,"Content-Length");
          if (iVar4 == 0) {
            auth._0_4_ = 1;
          }
          iVar4 = strcasecmp((char *)(pn[-2].itr)->vt,"Transfer-Encoding");
          if (iVar4 == 0) {
            auth._0_4_ = 2;
          }
          iVar4 = strcasecmp((char *)(pn[-2].itr)->vt,"Proxy-Authenticate");
          if (iVar4 == 0) {
            auth._0_4_ = 3;
          }
          iVar4 = strcasecmp((char *)(pn[-2].itr)->vt,"Proxy-Connection");
          if (iVar4 == 0) {
            auth._0_4_ = 4;
          }
          _Var3 = get_separator((HttpProxyNegotiator *)s_00,':');
          if (_Var3) {
            if ((int)auth == 1) {
              _Var3 = get_token((HttpProxyNegotiator *)s_00);
              if (_Var3) {
                uVar5 = strtoumax((char *)(pn[-2].itr)->vt,(char **)0x0,10);
                *(uintmax_t *)&pn[-1].done = uVar5;
              }
            }
            else if ((int)auth == 2) {
              while (_Var3 = get_token((HttpProxyNegotiator *)s_00), _Var3) {
                iVar4 = strcasecmp((char *)(pn[-2].itr)->vt,"chunked");
                if (iVar4 == 0) {
                  pn[-1].aborted = true;
                }
              }
            }
            else if (((int)auth == 0) || ((int)auth == 4)) {
              _Var3 = get_token((HttpProxyNegotiator *)s_00);
              if (_Var3) {
                iVar4 = strcasecmp((char *)(pn[-2].itr)->vt,"close");
                if (iVar4 == 0) {
                  *(undefined1 *)((long)&pn[-1].ps + 4) = 1;
                }
                else {
                  iVar4 = strcasecmp((char *)(pn[-2].itr)->vt,"keep-alive");
                  if (iVar4 == 0) {
                    *(undefined1 *)((long)&pn[-1].ps + 4) = 0;
                  }
                }
              }
            }
            else if ((int)auth == 3) {
              pHVar6 = parse_http_auth_header((HttpProxyNegotiator *)s_00);
              if (pHVar6->auth_type == *(HttpAuthType *)&(pn[-1].input)->head) {
                if ((pHVar6->auth_type == AUTH_DIGEST) &&
                   (pHVar6->digest_hash != *(HttpDigestHash *)&(pn[-1].input)->tail)) {
                  spr._31_1_ = *(HttpDigestHash *)&(pn[-1].input)->tail < pHVar6->digest_hash;
                }
                else {
                  spr._31_1_ = 1;
                }
              }
              else {
                spr._31_1_ = *(HttpAuthType *)&(pn[-1].input)->head < pHVar6->auth_type;
              }
              if (spr._31_1_ == '\0') {
                http_auth_details_free(pHVar6);
              }
              else {
                http_auth_details_free((HttpAuthDetails *)pn[-1].input);
                pn[-1].input = (bufchain *)pHVar6;
              }
            }
          }
        }
        if ((pn[-2].output[0].binarysink_[0].binarysink_)->binarysink_ == (BinarySink *)0x0) break;
LAB_00122107:
        strbuf_clear((strbuf *)pn[-2].output[0].binarysink_[0].binarysink_);
        *(undefined4 *)&s_00->write = 0x1ff;
      }
      if ((pn[-1].aborted & 1U) != 0) goto LAB_00122471;
      *(undefined4 *)&s_00->write = 0x264;
LAB_0012244a:
      _Var3 = bufchain_try_consume(pn->input,*(size_t *)&pn[-1].done);
      if (!_Var3) {
        return;
      }
LAB_0012269f:
      if ((*(int *)&pn[-1].ps < 200) || (299 < *(int *)&pn[-1].ps)) {
        if (*(int *)&pn[-1].ps != 0x197) {
          pcVar9 = dupprintf("HTTP response %s",
                             *(long *)pn[-2].output[0].binarysink_[0].writefmtv +
                             (long)*(int *)&pn[-2].done);
          pn->error = pcVar9;
          *(undefined4 *)&s_00->write = 0;
          return;
        }
        if (((ulong)pn[-1].ps & 0x100000000) != 0) {
          pn->reconnect = true;
        }
        if (*(int *)&(pn[-1].input)->head == 0) {
          pcVar9 = dupstr((char *)(pn[-1].input[1].head)->next);
          pn->error = pcVar9;
          *(undefined4 *)&s_00->write = 0;
          return;
        }
        if (((ulong)pn[-1].output[0].ch & 1) == 0) {
          if (((ulong)(pn[-1].input)->head & 0x100000000) == 0) {
            if (pn->itr == (Interactor *)0x0) {
              pcVar9 = dupprintf("HTTP proxy requested authentication which we do not have");
              pn->error = pcVar9;
              *(undefined4 *)&s_00->write = 0;
              return;
            }
            ppVar7 = proxy_new_prompts(pn->ps);
            pn[-1].output[0].binarysink_[0].binarysink_ = (BinarySink *)ppVar7;
            *(undefined1 *)&(pn[-1].output[0].binarysink_[0].binarysink_)->write = 1;
            *(undefined1 *)((long)&(pn[-1].output[0].binarysink_[0].binarysink_)->write + 1) = 0;
            p_Var8 = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)
                     dupstr("HTTP proxy authentication");
            (pn[-1].output[0].binarysink_[0].binarysink_)->writefmtv = p_Var8;
            if (*(long *)(*(long *)&pn[-2].aborted + 0x10) == 0) {
              *(int *)&pn[-1].itr = (int)pn[-1].output[0].binarysink_[0].binarysink_[1].binarysink_;
              ppVar7 = (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_;
              pcVar9 = dupstr("Proxy username: ");
              add_prompt(ppVar7,pcVar9,true);
            }
            else {
              *(undefined4 *)&pn[-1].itr = 0xffffffff;
            }
            *(int *)((long)&pn[-1].itr + 4) =
                 (int)pn[-1].output[0].binarysink_[0].binarysink_[1].binarysink_;
            ppVar7 = (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_;
            pcVar9 = dupstr("Proxy password: ");
            add_prompt(ppVar7,pcVar9,false);
            goto LAB_00122865;
          }
        }
        else {
          *(undefined1 *)&pn[-1].output[0].ch = 0;
        }
        goto LAB_001218ae;
      }
      pn->done = true;
    }
    else {
      if (iVar4 == 0x264) goto LAB_0012244a;
      if (iVar4 == 0x271) goto LAB_0012248c;
      if (iVar4 == 0x289) goto LAB_001225f5;
      if (iVar4 == 0x28f) {
        while( true ) {
          _Var3 = bufchain_try_fetch_consume(pn->input,&spr.field_0x1c,2);
          if (!_Var3) {
            return;
          }
          if (spr._28_2_ != 0xa0d) {
            pcVar9 = dupprintf("Missing CRLF after chunk during HTTP chunked transfer encoding");
            pn->error = pcVar9;
            *(undefined4 *)&s_00->write = 0;
            return;
          }
          if (pn[-1].error == (char *)0x0) break;
LAB_00122471:
          pn[-1].error = (char *)0x0;
          while( true ) {
            do {
              *(undefined4 *)&s_00->write = 0x271;
LAB_0012248c:
              _Var3 = bufchain_try_fetch_consume(pn->input,&spr.field_0x1e,1);
              if (!_Var3) {
                return;
              }
            } while (spr._30_1_ == '\r');
            if (spr._30_1_ == '\n') break;
            if (((char)spr._30_1_ < '0') || ('9' < (char)spr._30_1_)) {
              if (((char)spr._30_1_ < 'A') || ('F' < (char)spr._30_1_)) {
                if (((char)spr._30_1_ < 'a') || ('f' < (char)spr._30_1_)) {
                  pcVar9 = dupprintf("Received bad character 0x%02X in chunk length during HTTP chunked transfer encoding"
                                     ,(ulong)(byte)spr._30_1_);
                  pn->error = pcVar9;
                  *(undefined4 *)&s_00->write = 0;
                  return;
                }
                pn[-1].error = (char *)((long)pn[-1].error * 0x10 + (long)((char)spr._30_1_ + -0x57)
                                       );
              }
              else {
                pn[-1].error = (char *)((long)pn[-1].error * 0x10 + (long)((char)spr._30_1_ + -0x37)
                                       );
              }
            }
            else {
              pn[-1].error = (char *)((long)pn[-1].error * 0x10 + (long)((char)spr._30_1_ + -0x30));
            }
          }
          *(undefined4 *)&s_00->write = 0x289;
LAB_001225f5:
          _Var3 = bufchain_try_consume(pn->input,(size_t)pn[-1].error);
          if (!_Var3) {
            return;
          }
          *(undefined4 *)&s_00->write = 0x28f;
        }
        goto LAB_0012269f;
      }
      if (iVar4 == 0x2e6) {
LAB_00122865:
        iseat = interactor_announce(pn->itr);
        seat_get_userpass_input
                  ((SeatPromptResult *)local_3d8,iseat,
                   (prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
        if (local_3d8._0_4_ != SPRK_OK) {
          spr_01.errfn = spr.errfn;
          spr_01.kind = spr.kind;
          spr_01._4_4_ = spr._4_4_;
          spr_01.errdata_lit = spr.errdata_lit;
          spr_01._24_8_ = in_stack_fffffffffffffb18;
          _Var3 = spr_is_abort(spr_01);
          if (!_Var3) {
            *(undefined4 *)&s_00->write = 0x2e6;
            return;
          }
          spr_00._4_4_ = local_3d8._4_4_;
          spr_00.kind = local_3d8._0_4_;
          spr_00.errfn = (_func_void_SeatPromptResult_BinarySink_ptr *)spr._0_8_;
          spr_00.errdata_lit = (char *)spr.errfn;
          spr_00._24_8_ = spr.errdata_lit;
          proxy_spr_abort(pn,spr_00);
          *(undefined4 *)&s_00->write = 0;
          return;
        }
        if (*(int *)&pn[-1].itr != -1) {
          strbuf_clear(*(strbuf **)&pn[-2].aborted);
          lVar1 = *(long *)&pn[-2].aborted;
          pcVar9 = prompt_get_result_ref
                             (*(prompt_t **)
                               (pn[-1].output[0].binarysink_[0].binarysink_[2].writefmtv +
                               (long)*(int *)&pn[-1].itr * 8));
          pVar10 = ptrlen_from_asciz(pcVar9);
          BinarySink_put_datapl((BinarySink *)(lVar1 + 0x18),pVar10);
        }
        strbuf_clear((strbuf *)pn[-1].vt);
        pPVar2 = pn[-1].vt;
        pcVar9 = prompt_get_result_ref
                           (*(prompt_t **)
                             (pn[-1].output[0].binarysink_[0].binarysink_[2].writefmtv +
                             (long)*(int *)((long)&pn[-1].itr + 4) * 8));
        pVar10 = ptrlen_from_asciz(pcVar9);
        BinarySink_put_datapl((BinarySink *)&pPVar2->type,pVar10);
        free_prompts((prompts_t *)pn[-1].output[0].binarysink_[0].binarysink_);
        pn[-1].output[0].binarysink_[0].binarysink_ = (BinarySink *)0x0;
        goto LAB_001218ae;
      }
    }
    *(undefined4 *)&s_00->write = 0;
  }
  return;
}

Assistant:

static void proxy_http_process_queue(ProxyNegotiator *pn)
{
    HttpProxyNegotiator *s = container_of(pn, HttpProxyNegotiator, pn);

    crBegin(s->crLine);

    /*
     * Initialise our username and password strbufs from the Conf.
     */
    put_dataz(s->username, conf_get_str(pn->ps->conf, CONF_proxy_username));
    put_dataz(s->password, conf_get_str(pn->ps->conf, CONF_proxy_password));
    if (s->username->len || s->password->len)
        s->try_auth_from_conf = true;

    /*
     * Set up the host:port string we're trying to connect to, also
     * used as the URI string in HTTP Digest auth.
     */
    {
        char dest[512];
        sk_getaddr(pn->ps->remote_addr, dest, lenof(dest));
        put_fmt(s->uri, "%s:%d", dest, pn->ps->remote_port);
    }

    while (true) {
        /*
         * Standard prefix for the HTTP CONNECT request.
         */
        put_fmt(pn->output,
                "CONNECT %s HTTP/1.1\r\n"
                "Host: %s\r\n", s->uri->s, s->uri->s);

        /*
         * Add an auth header, if we're planning to this time round.
         */
        if (s->next_auth->auth_type == AUTH_BASIC) {
            put_datalit(pn->output, "Proxy-Authorization: Basic ");

            strbuf *base64_input = strbuf_new_nm();
            put_datapl(base64_input, ptrlen_from_strbuf(s->username));
            put_byte(base64_input, ':');
            put_datapl(base64_input, ptrlen_from_strbuf(s->password));

            char base64_output[4];
            for (size_t i = 0, e = base64_input->len; i < e; i += 3) {
                base64_encode_atom(base64_input->u + i,
                                   e-i > 3 ? 3 : e-i, base64_output);
                put_data(pn->output, base64_output, 4);
            }
            strbuf_free(base64_input);
            smemclr(base64_output, sizeof(base64_output));
            put_datalit(pn->output, "\r\n");
        } else if (s->next_auth->auth_type == AUTH_DIGEST) {
            put_datalit(pn->output, "Proxy-Authorization: Digest ");

            /* If we have a fresh nonce, reset the
             * nonce count. Otherwise, keep incrementing it. */
            if (!ptrlen_eq_ptrlen(ptrlen_from_strbuf(s->token),
                                  ptrlen_from_strbuf(s->next_auth->nonce)))
                s->nonce_count = 0;

            http_digest_response(BinarySink_UPCAST(pn->output),
                                 ptrlen_from_strbuf(s->username),
                                 ptrlen_from_strbuf(s->password),
                                 ptrlen_from_strbuf(s->next_auth->realm),
                                 PTRLEN_LITERAL("CONNECT"),
                                 ptrlen_from_strbuf(s->uri),
                                 PTRLEN_LITERAL("auth"),
                                 ptrlen_from_strbuf(s->next_auth->nonce),
                                 (s->next_auth->got_opaque ?
                                  ptrlen_from_strbuf(s->next_auth->opaque) :
                                  make_ptrlen(NULL, 0)),
                                 ++s->nonce_count, s->next_auth->digest_hash,
                                 s->next_auth->hash_username);
            put_datalit(pn->output, "\r\n");
        }

        /*
         * Blank line to terminate the HTTP request.
         */
        put_datalit(pn->output, "\r\n");
        crReturnV;

        s->content_length = 0;
        s->chunked_transfer = false;
        s->connection_close = false;

        /*
         * Read and parse the HTTP status line, and check if it's a 2xx
         * for success.
         */
        strbuf_clear(s->response);
        crMaybeWaitUntilV(read_line(pn->input, s->response, false));
        {
            int maj_ver, min_ver, n_scanned;
            n_scanned = sscanf(
                s->response->s, "HTTP/%d.%d %n%d",
                &maj_ver, &min_ver, &s->http_status_pos, &s->http_status);

            if (n_scanned < 3) {
                pn->error = dupstr("HTTP response was absent or malformed");
                crStopV;
            }

            if (maj_ver < 1 || (maj_ver == 1 && min_ver < 1)) {
                /* Before HTTP/1.1, connections close by default */
                s->connection_close = true;
            }
        }

        if (s->http_status == 407) {
            /*
             * If this is going to be an auth request, we expect to
             * see at least one Proxy-Authorization header offering us
             * auth options. Start by preloading s->next_auth with a
             * fallback error message, which will be used if nothing
             * better is available.
             */
            http_auth_details_free(s->next_auth);
            s->next_auth = http_auth_details_new();
            auth_error(s->next_auth, "no Proxy-Authorization header seen in "
                       "HTTP 407 Proxy Authentication Required response");
        }

        /*
         * Read the HTTP response header section.
         */
        do {
            strbuf_clear(s->header);
            crMaybeWaitUntilV(read_line(pn->input, s->header, true));
            s->header_pos = 0;

            if (!get_token(s)) {
                /* Possibly we ought to panic if we see an HTTP header
                 * we can't make any sense of at all? But whatever,
                 * ignore it and hope the next one makes more sense */
                continue;
            }

            /* Parse the header name */
            HttpHeader hdr = HDR_UNKNOWN;
            {
                #define CHECK_HEADER(id, string) \
                    if (!stricmp(s->token->s, string)) hdr = id;
                HTTP_HEADER_LIST(CHECK_HEADER);
                #undef CHECK_HEADER
            }

            if (!get_separator(s, ':'))
                continue;

            if (hdr == HDR_CONTENT_LENGTH) {
                if (!get_token(s))
                    continue;
                s->content_length = strtoumax(s->token->s, NULL, 10);
            } else if (hdr == HDR_TRANSFER_ENCODING) {
                /*
                 * The Transfer-Encoding header value should be a
                 * comma-separated list of keywords including
                 * "chunked", "deflate" and "gzip". We parse it in the
                 * most superficial way, by just looking for "chunked"
                 * and ignoring everything else.
                 *
                 * It's OK to do that because we're not actually
                 * _using_ the error document - we only have to skip
                 * over it to find the end of the HTTP response. So we
                 * don't care if it's gzipped or not.
                 */
                while (get_token(s)) {
                    if (!stricmp(s->token->s, "chunked"))
                        s->chunked_transfer = true;
                }
            } else if (hdr == HDR_CONNECTION ||
                       hdr == HDR_PROXY_CONNECTION) {
                if (!get_token(s))
                    continue;
                if (!stricmp(s->token->s, "close"))
                    s->connection_close = true;
                else if (!stricmp(s->token->s, "keep-alive"))
                    s->connection_close = false;
            } else if (hdr == HDR_PROXY_AUTHENTICATE) {
                HttpAuthDetails *auth = parse_http_auth_header(s);

                /*
                 * See if we prefer this set of auth details to the
                 * previous one we had (either from a previous auth
                 * header, or the fallback when no auth header is
                 * provided at all).
                 */
                bool change;

                if (auth->auth_type != s->next_auth->auth_type) {
                    /* Use the preference order implied by the enum */
                    change = auth->auth_type > s->next_auth->auth_type;
                } else if (auth->auth_type == AUTH_DIGEST &&
                           auth->digest_hash != s->next_auth->digest_hash) {
                    /* Choose based on the hash functions */
                    change = auth->digest_hash > s->next_auth->digest_hash;
                } else {
                    /*
                     * If in doubt, go with the later one of the
                     * headers.
                     *
                     * The main reason for this is so that an error in
                     * interpreting an auth header will supersede the
                     * default error we preload saying 'no header
                     * found', because that would be a particularly
                     * bad error to report if there _was_ one.
                     *
                     * But we're in a tie-breaking situation by now,
                     * so there's no other reason to choose - we might
                     * as well apply the same policy everywhere else
                     * too.
                     */
                    change = true;
                }

                if (change) {
                    http_auth_details_free(s->next_auth);
                    s->next_auth = auth;
                } else {
                    http_auth_details_free(auth);
                }
            }
        } while (s->header->len > 0);

        /* Read and ignore the entire response document */
        if (!s->chunked_transfer) {
            /* Simple approach: read exactly Content-Length bytes */
            crMaybeWaitUntilV(bufchain_try_consume(
                                  pn->input, s->content_length));
        } else {
            /* Chunked transfer: read a sequence of
             * <hex length>\r\n<data>\r\n chunks, terminating in one with
             * zero length */
            do {
                /*
                 * Expect a chunk length
                 */
                s->chunk_length = 0;
                while (true) {
                    char c;
                    crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                          pn->input, &c, 1));
                    if (c == '\r') {
                        continue;
                    } else if (c == '\n') {
                        break;
                    } else if ('0' <= c && c <= '9') {
                        s->chunk_length = s->chunk_length*16 + (c-'0');
                    } else if ('A' <= c && c <= 'F') {
                        s->chunk_length = s->chunk_length*16 + (c-'A'+10);
                    } else if ('a' <= c && c <= 'f') {
                        s->chunk_length = s->chunk_length*16 + (c-'a'+10);
                    } else {
                        pn->error = dupprintf(
                            "Received bad character 0x%02X in chunk length "
                            "during HTTP chunked transfer encoding",
                            (unsigned)(unsigned char)c);
                        crStopV;
                    }
                }

                /*
                 * Expect that many bytes of chunked data
                 */
                crMaybeWaitUntilV(bufchain_try_consume(
                                      pn->input, s->chunk_length));

                /* Now expect \r\n */
                {
                    char buf[2];
                    crMaybeWaitUntilV(bufchain_try_fetch_consume(
                                          pn->input, buf, 2));
                    if (memcmp(buf, "\r\n", 2)) {
                        pn->error = dupprintf(
                            "Missing CRLF after chunk "
                            "during HTTP chunked transfer encoding");
                        crStopV;
                    }
                }
            } while (s->chunk_length);
        }

        if (200 <= s->http_status && s->http_status < 300) {
            /* Any 2xx HTTP response means we're done */
            goto authenticated;
        } else if (s->http_status == 407) {
            /* 407 is Proxy Authentication Required, which we may be
             * able to do something about. */
            if (s->connection_close) {
                /* If we got 407 + connection closed, reconnect before
                 * sending our next request. */
                pn->reconnect = true;
            }

            /* If the best we can do is report some kind of error from
             * a Proxy-Auth header (or an error saying there wasn't
             * one at all), and no successful parsing of an auth
             * header superseded that, then just throw that error and
             * die. */
            if (s->next_auth->auth_type == AUTH_ERROR) {
                pn->error = dupstr(s->next_auth->error->s);
                crStopV;
            }

            /* If we have auth details from the Conf and haven't tried
             * them yet, that's our first step. */
            if (s->try_auth_from_conf) {
                s->try_auth_from_conf = false;
                continue;
            }

            /* If the server sent us stale="true" in a Digest auth
             * header, that means we _don't_ need to request a new
             * password yet; just try again with the existing details
             * and the fresh nonce it sent us. */
            if (s->next_auth->digest_nonce_was_stale)
                continue;

            /* Either we never had a password in the first place, or
             * the one we already presented was rejected. We can only
             * proceed from here if we have a way to ask the user
             * questions. */
            if (!pn->itr) {
                pn->error = dupprintf("HTTP proxy requested authentication "
                                      "which we do not have");
                crStopV;
            }

            /*
             * Send some prompts to the user. We'll assume the
             * password is always required (since it's just been
             * rejected, even if we did send one before), and we'll
             * prompt for the username only if we don't have one from
             * the Conf.
             */
            s->prompts = proxy_new_prompts(pn->ps);
            s->prompts->to_server = true;
            s->prompts->from_server = false;
            s->prompts->name = dupstr("HTTP proxy authentication");
            if (!s->username->len) {
                s->username_prompt_index = s->prompts->n_prompts;
                add_prompt(s->prompts, dupstr("Proxy username: "), true);
            } else {
                s->username_prompt_index = -1;
            }

            s->password_prompt_index = s->prompts->n_prompts;
            add_prompt(s->prompts, dupstr("Proxy password: "), false);

            while (true) {
                SeatPromptResult spr = seat_get_userpass_input(
                    interactor_announce(pn->itr), s->prompts);
                if (spr.kind == SPRK_OK) {
                    break;
                } else if (spr_is_abort(spr)) {
                    proxy_spr_abort(pn, spr);
                    crStopV;
                }
                crReturnV;
            }

            if (s->username_prompt_index != -1) {
                strbuf_clear(s->username);
                put_dataz(s->username,
                          prompt_get_result_ref(
                              s->prompts->prompts[s->username_prompt_index]));
            }

            strbuf_clear(s->password);
            put_dataz(s->password,
                      prompt_get_result_ref(
                          s->prompts->prompts[s->password_prompt_index]));

            free_prompts(s->prompts);
            s->prompts = NULL;
        } else {
            /* Any other HTTP response is treated as permanent failure */
            pn->error = dupprintf("HTTP response %s",
                                  s->response->s + s->http_status_pos);
            crStopV;
        }
    }

  authenticated:
    /*
     * Success! Hand over to the main connection.
     */
    pn->done = true;

    crFinishV;
}